

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O3

void __thiscall w3Interp::Eq_i32_(w3Interp *this)

{
  w3Stack *this_00;
  pointer *ppwVar1;
  int iVar2;
  int iVar3;
  Value *pVVar4;
  w3StackValue local_50;
  
  this_00 = &this->super_w3Stack;
  pVVar4 = w3Stack::value(this_00,Tag_i32);
  iVar3 = pVVar4->i32;
  w3Stack::AssertTopIsValue(this_00);
  ppwVar1 = &(this->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
             super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
             super__Vector_impl_data._M_finish;
  *ppwVar1 = *ppwVar1 + -1;
  pVVar4 = w3Stack::value(this_00,Tag_i32);
  iVar2 = pVVar4->i32;
  w3Stack::AssertTopIsValue(this_00);
  ppwVar1 = &(this->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
             super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
             super__Vector_impl_data._M_finish;
  *ppwVar1 = *ppwVar1 + -1;
  local_50.frame = (w3Frame *)0x0;
  local_50.label.arity = 0;
  local_50.label.continuation = 0;
  local_50.tag = Tag_Value;
  local_50.value.tag = Tag_i32;
  local_50.value._1_7_ = 0;
  local_50.value.value.u64._1_7_ = 0;
  local_50.value.value.i32._0_1_ = iVar3 == iVar2;
  w3Stack::push_value(this_00,&local_50);
  return;
}

Assistant:

INTERP (Eq_i32_)
{
    push_bool (pop_i32 () == pop_i32 ());
}